

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<Fad<double>_>::Fill
          (TPZVec<Fad<double>_> *this,Fad<double> *copy,int64_t from,int64_t numelem)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  int64_t i;
  long lVar4;
  
  if (numelem < -1) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"TPZVec::Fill");
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"It\'s negative parameter numelem, then numelem = ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::ostream::flush();
  }
  lVar4 = 0;
  if (0 < from) {
    lVar4 = from;
  }
  lVar3 = this->fNElements;
  if (lVar3 <= lVar4) {
    lVar4 = lVar3;
  }
  if (numelem < 0) {
    numelem = lVar3;
  }
  lVar2 = numelem + from;
  if (lVar3 <= numelem + from) {
    lVar2 = lVar3;
  }
  lVar3 = lVar4 << 5;
  for (; lVar4 < lVar2; lVar4 = lVar4 + 1) {
    Fad<double>::operator=((Fad<double> *)((long)&this->fStore->val_ + lVar3),copy);
    lVar3 = lVar3 + 0x20;
  }
  return;
}

Assistant:

void TPZVec<T>::Fill(const T& copy, const int64_t from, const int64_t numelem){
#ifndef PZNODEBUG
	if(numelem<0 && numelem != -1) {
		PZError << "TPZVec::Fill" << std::endl
		<< "It's negative parameter numelem, then numelem = "
		<< fNElements << std::endl;
		
		PZError.flush();
	}
#endif
	
	int64_t first = (from < 0) ? 0 : from;
	int64_t nel = numelem;
	first = (first > fNElements) ? fNElements : first;
	if (nel < 0) nel = fNElements;
	int64_t last = (from+nel > fNElements) ? fNElements : from+nel;
	
	for(int64_t i=first; i<last; i++)
		fStore[i] = copy;
}